

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

string * __thiscall
t_py_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_py_generator *this)

{
  bool gen_twisted;
  t_program *ptVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  pointer pptVar5;
  long *local_c0;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  ptVar1 = (this->super_t_generator).program_;
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pptVar5 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_78 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (pptVar5 != local_78) {
    do {
      ptVar1 = *pptVar5;
      gen_twisted = this->gen_twisted_;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar2 = (this->package_prefix_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (this->package_prefix_)._M_string_length);
      get_real_py_module(&local_50,ptVar1,gen_twisted,&local_70);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3838c9);
      local_a0 = &local_90;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_90 = *plVar4;
        lStack_88 = plVar3[3];
      }
      else {
        local_90 = *plVar4;
        local_a0 = (long *)*plVar3;
      }
      local_98 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
      local_c0 = &local_b0;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_b0 = *plVar4;
        lStack_a8 = plVar3[3];
      }
      else {
        local_b0 = *plVar4;
        local_c0 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 != local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_py_generator::render_includes() {
  const vector<t_program*>& includes = program_->get_includes();
  string result = "";
  for (auto include : includes) {
    result += "import " + get_real_py_module(include, gen_twisted_, package_prefix_) + ".ttypes\n";
  }
  return result;
}